

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O2

void fast_float::parse_mantissa<char>
               (bigint *result,parsed_number_string_t<char> *num,size_t max_digits,size_t *digits)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  long *plVar13;
  ulong uVar14;
  limb lVar15;
  bool bVar16;
  
  *digits = 0;
  plVar6 = (long *)(num->integer).ptr;
  sVar3 = (num->integer).length;
  plVar7 = (long *)((long)plVar6 + sVar3);
  for (; (7 < (long)sVar3 && (*plVar6 == 0x3030303030303030)); plVar6 = plVar6 + 1) {
    sVar3 = sVar3 - 8;
  }
  for (; (plVar13 = plVar7, sVar3 != 0 && (plVar13 = plVar6, (char)*plVar6 == '0'));
      plVar6 = (long *)((long)plVar6 + 1)) {
    sVar3 = sVar3 - 1;
  }
  while (plVar6 = plVar13, plVar6 != plVar7) {
    sVar3 = *digits;
    lVar10 = (long)plVar7 - (long)plVar6;
    uVar9 = 0;
    lVar15 = 0;
    lVar12 = lVar10;
    for (lVar4 = -sVar3; ((7 < lVar12 && (uVar9 < 0xc)) && (7 < max_digits + lVar4));
        lVar4 = lVar4 + -8) {
      uVar14 = *(long *)((long)plVar6 + uVar9) + 0xcfcfcfcfcfcfcfd0;
      uVar14 = (uVar14 >> 8) + uVar14 * 10;
      lVar15 = ((uVar14 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                (uVar14 & 0xff000000ff) * 0xf424000000064 >> 0x20) + lVar15 * 100000000;
      sVar1 = sVar3 + 8 + uVar9;
      uVar9 = uVar9 + 8;
      *digits = sVar1;
      lVar12 = lVar12 + -8;
    }
    lVar12 = 0;
    puVar5 = &powers_of_ten_uint64;
    for (; ((plVar13 = (long *)((long)plVar6 + lVar12 + uVar9), uVar9 + lVar12 < 0x13 &&
            (plVar13 != plVar7)) && (uVar9 + sVar3 < max_digits)); sVar3 = sVar3 + 1) {
      lVar15 = (lVar15 * 10 + (long)(char)*plVar13) - 0x30;
      *digits = uVar9 + sVar3 + 1;
      lVar10 = lVar10 + -1;
      puVar5 = puVar5 + 1;
      lVar12 = lVar12 + 1;
    }
    small_mul<(unsigned_short)62>(&result->vec,puVar5[uVar9]);
    bigint::add(result,lVar15);
    if (sVar3 + -max_digits + uVar9 == 0) goto code_r0x0012a08e;
  }
  plVar7 = (long *)(num->fraction).ptr;
  if (plVar7 == (long *)0x0) {
    return;
  }
  sVar3 = (num->fraction).length;
  plVar6 = (long *)(sVar3 + (long)plVar7);
  plVar13 = plVar7;
  if (*digits == 0) {
    for (; (7 < (long)sVar3 && (*plVar7 == 0x3030303030303030)); plVar7 = plVar7 + 1) {
      sVar3 = sVar3 - 8;
    }
    for (; (plVar13 = plVar6, sVar3 != 0 && (plVar13 = plVar7, (char)*plVar7 == '0'));
        plVar7 = (long *)((long)plVar7 + 1)) {
      sVar3 = sVar3 - 1;
    }
  }
  do {
    plVar7 = plVar13;
    if (plVar7 == plVar6) {
      return;
    }
    sVar3 = *digits;
    lVar10 = (long)plVar6 - (long)plVar7;
    uVar9 = 0;
    lVar15 = 0;
    lVar12 = lVar10;
    for (lVar4 = -sVar3; ((7 < lVar12 && (uVar9 < 0xc)) && (7 < max_digits + lVar4));
        lVar4 = lVar4 + -8) {
      uVar14 = *(long *)((long)plVar7 + uVar9) + 0xcfcfcfcfcfcfcfd0;
      uVar14 = (uVar14 >> 8) + uVar14 * 10;
      lVar15 = ((uVar14 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                (uVar14 & 0xff000000ff) * 0xf424000000064 >> 0x20) + lVar15 * 100000000;
      sVar1 = sVar3 + 8 + uVar9;
      uVar9 = uVar9 + 8;
      *digits = sVar1;
      lVar12 = lVar12 + -8;
    }
    lVar12 = 0;
    puVar5 = &powers_of_ten_uint64;
    for (; ((plVar13 = (long *)((long)plVar7 + lVar12 + uVar9), uVar9 + lVar12 < 0x13 &&
            (plVar13 != plVar6)) && (uVar9 + sVar3 < max_digits)); sVar3 = sVar3 + 1) {
      lVar15 = (lVar15 * 10 + (long)(char)*plVar13) - 0x30;
      *digits = uVar9 + sVar3 + 1;
      lVar10 = lVar10 + -1;
      puVar5 = puVar5 + 1;
      lVar12 = lVar12 + 1;
    }
    small_mul<(unsigned_short)62>(&result->vec,puVar5[uVar9]);
    bigint::add(result,lVar15);
  } while (sVar3 + -max_digits + uVar9 != 0);
  lVar10 = lVar10 - uVar9;
  plVar7 = (long *)((long)plVar7 + lVar12 + uVar9);
  while( true ) {
    if (lVar10 < 8) {
      do {
        if (plVar7 == plVar6) {
          return;
        }
        lVar12 = *plVar7;
        plVar7 = (long *)((long)plVar7 + 1);
      } while ((char)lVar12 == '0');
      break;
    }
    if (*plVar7 != 0x3030303030303030) break;
    plVar7 = plVar7 + 1;
    lVar10 = lVar10 + -8;
  }
  goto LAB_0012a328;
code_r0x0012a08e:
  plVar6 = (long *)((long)plVar6 + lVar12 + uVar9);
  for (lVar10 = lVar10 - uVar9; 7 < lVar10; lVar10 = lVar10 + -8) {
    if (*plVar6 != 0x3030303030303030) {
      pcVar8 = (num->fraction).ptr;
      bVar16 = true;
      if (pcVar8 != (char *)0x0) goto LAB_0012a2f6;
      goto LAB_0012a328;
    }
    plVar6 = plVar6 + 1;
  }
  do {
    plVar13 = plVar6;
    bVar16 = plVar13 != plVar7;
    if (!bVar16) break;
    plVar6 = (long *)((long)plVar13 + 1);
  } while ((char)*plVar13 == '0');
  pcVar8 = (num->fraction).ptr;
  if (pcVar8 == (char *)0x0) {
    if (plVar13 == plVar7) {
      return;
    }
  }
  else {
LAB_0012a2f6:
    sVar3 = 0;
    sVar1 = (num->fraction).length;
    for (sVar11 = sVar1; 7 < (long)sVar11; sVar11 = sVar11 - 8) {
      if (*(long *)(pcVar8 + sVar3) != 0x3030303030303030) goto LAB_0012a328;
      sVar3 = sVar3 + 8;
    }
    do {
      if (sVar1 == sVar3) {
        if (!bVar16) {
          return;
        }
        break;
      }
      pcVar2 = pcVar8 + sVar3;
      sVar3 = sVar3 + 1;
    } while (*pcVar2 == '0');
  }
LAB_0012a328:
  small_mul<(unsigned_short)62>(&result->vec,10);
  bigint::add(result,1);
  *digits = *digits + 1;
  return;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
void parse_mantissa(bigint& result, parsed_number_string_t<UC>& num, size_t max_digits, size_t& digits) noexcept {
  // try to minimize the number of big integer and scalar multiplication.
  // therefore, try to parse 8 digits at a time, and multiply by the largest
  // scalar value (9 or 19 digits) for each step.
  size_t counter = 0;
  digits = 0;
  limb value = 0;
#ifdef FASTFLOAT_64BIT_LIMB
  size_t step = 19;
#else
  size_t step = 9;
#endif

  // process all integer digits.
  UC const * p = num.integer.ptr;
  UC const * pend = p + num.integer.len();
  skip_zeros(p, pend);
  // process all digits, in increments of step per loop
  while (p != pend) {
    while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
      parse_eight_digits(p, value, counter, digits);
    }
    while (counter < step && p != pend && digits < max_digits) {
      parse_one_digit(p, value, counter, digits);
    }
    if (digits == max_digits) {
      // add the temporary value, then check if we've truncated any digits
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      bool truncated = is_truncated(p, pend);
      if (num.fraction.ptr != nullptr) {
        truncated |= is_truncated(num.fraction);
      }
      if (truncated) {
        round_up_bigint(result, digits);
      }
      return;
    } else {
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      counter = 0;
      value = 0;
    }
  }

  // add our fraction digits, if they're available.
  if (num.fraction.ptr != nullptr) {
    p = num.fraction.ptr;
    pend = p + num.fraction.len();
    if (digits == 0) {
      skip_zeros(p, pend);
    }
    // process all digits, in increments of step per loop
    while (p != pend) {
      while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
        parse_eight_digits(p, value, counter, digits);
      }
      while (counter < step && p != pend && digits < max_digits) {
        parse_one_digit(p, value, counter, digits);
      }
      if (digits == max_digits) {
        // add the temporary value, then check if we've truncated any digits
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        bool truncated = is_truncated(p, pend);
        if (truncated) {
          round_up_bigint(result, digits);
        }
        return;
      } else {
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        counter = 0;
        value = 0;
      }
    }
  }

  if (counter != 0) {
    add_native(result, limb(powers_of_ten_uint64[counter]), value);
  }
}